

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

bool embree::avx::OrientedDiscMiMBIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  Scene *pSVar11;
  Geometry *pGVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [16];
  float fVar48;
  undefined1 auVar45 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  float fVar51;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar52 [64];
  undefined1 auVar56 [16];
  RTCFilterFunctionNArguments args;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [8];
  float fStack_288;
  float fStack_284;
  Primitive *local_280;
  undefined8 uStack_278;
  RTCFilterFunctionNArguments local_270;
  undefined1 local_240 [16];
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float local_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [16];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar11 = context->scene;
  uVar28 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar12 = (pSVar11->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar12->time_range).lower;
  fVar1 = pGVar12->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar12->time_range).upper - fVar1));
  auVar29 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar29 = vminss_avx(auVar29,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar41 = vmaxss_avx(ZEXT816(0) << 0x20,auVar29);
  iVar22 = (int)auVar41._0_4_;
  lVar13 = *(long *)&pGVar12[2].numPrimitives;
  lVar27 = (long)iVar22 * 0x38;
  lVar14 = *(long *)(lVar13 + 0x10 + lVar27);
  lVar26 = *(long *)(lVar13 + lVar27);
  auVar29 = *(undefined1 (*) [16])(lVar26 + lVar14 * uVar28);
  uVar25 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar38 = *(undefined1 (*) [16])(lVar26 + lVar14 * uVar25);
  uVar23 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar30 = *(undefined1 (*) [16])(lVar26 + lVar14 * uVar23);
  uVar24 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar35 = *(undefined1 (*) [16])(lVar26 + lVar14 * uVar24);
  p_Var15 = pGVar12[2].intersectionFilterN;
  lVar14 = *(long *)(p_Var15 + lVar27);
  lVar26 = *(long *)(p_Var15 + lVar27 + 0x10);
  auVar36 = *(undefined1 (*) [16])(lVar14 + lVar26 * uVar28);
  auVar31 = *(undefined1 (*) [16])(lVar14 + lVar26 * uVar25);
  auVar9 = *(undefined1 (*) [16])(lVar14 + lVar26 * uVar23);
  auVar40 = *(undefined1 (*) [16])(lVar14 + lVar26 * uVar24);
  lVar26 = (long)(iVar22 + 1) * 0x38;
  lVar14 = *(long *)(lVar13 + lVar26);
  lVar13 = *(long *)(lVar13 + 0x10 + lVar26);
  auVar44 = *(undefined1 (*) [16])(lVar14 + lVar13 * uVar28);
  auVar42 = *(undefined1 (*) [16])(lVar14 + lVar13 * uVar25);
  auVar49 = *(undefined1 (*) [16])(lVar14 + lVar13 * uVar23);
  auVar56 = *(undefined1 (*) [16])(lVar14 + lVar13 * uVar24);
  lVar13 = *(long *)(p_Var15 + lVar26);
  lVar14 = *(long *)(p_Var15 + lVar26 + 0x10);
  auVar32 = *(undefined1 (*) [16])(lVar13 + uVar28 * lVar14);
  auVar37 = *(undefined1 (*) [16])(lVar13 + uVar25 * lVar14);
  fVar1 = fVar1 - auVar41._0_4_;
  auVar17 = vunpcklps_avx(auVar29,auVar30);
  auVar41 = vunpckhps_avx(auVar29,auVar30);
  auVar29 = vunpcklps_avx(auVar38,auVar35);
  auVar16 = vunpckhps_avx(auVar38,auVar35);
  auVar18 = vunpcklps_avx(auVar17,auVar29);
  auVar30 = vunpckhps_avx(auVar17,auVar29);
  auVar17 = vunpcklps_avx(auVar36,auVar9);
  auVar38 = vunpckhps_avx(auVar36,auVar9);
  auVar36 = vunpcklps_avx(auVar31,auVar40);
  auVar35 = vunpckhps_avx(auVar31,auVar40);
  auVar29 = *(undefined1 (*) [16])(lVar13 + uVar23 * lVar14);
  auVar19 = vunpcklps_avx(auVar38,auVar35);
  auVar20 = vunpcklps_avx(auVar17,auVar36);
  auVar35 = vunpckhps_avx(auVar17,auVar36);
  auVar38 = vunpcklps_avx(auVar44,auVar49);
  auVar31 = vunpckhps_avx(auVar44,auVar49);
  auVar36 = vunpcklps_avx(auVar42,auVar56);
  auVar9 = vunpckhps_avx(auVar42,auVar56);
  auVar44 = vunpcklps_avx(auVar38,auVar36);
  auVar36 = vunpckhps_avx(auVar38,auVar36);
  auVar40 = vunpcklps_avx(auVar32,auVar29);
  auVar38 = vunpckhps_avx(auVar32,auVar29);
  auVar29 = *(undefined1 (*) [16])(lVar13 + lVar14 * uVar24);
  auVar42 = vunpcklps_avx(auVar37,auVar29);
  auVar29 = vunpckhps_avx(auVar37,auVar29);
  auVar49 = vunpcklps_avx(auVar38,auVar29);
  auVar56 = vunpcklps_avx(auVar40,auVar42);
  auVar40 = vunpckhps_avx(auVar40,auVar42);
  auVar29 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar38 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  fVar51 = auVar29._0_4_;
  fVar53 = auVar29._4_4_;
  fVar54 = auVar29._8_4_;
  fVar55 = auVar29._12_4_;
  fVar43 = auVar38._0_4_;
  fVar46 = auVar38._4_4_;
  fVar47 = auVar38._8_4_;
  fVar48 = auVar38._12_4_;
  auVar42._0_4_ = fVar51 * auVar44._0_4_ + fVar43 * auVar18._0_4_;
  auVar42._4_4_ = fVar53 * auVar44._4_4_ + fVar46 * auVar18._4_4_;
  auVar42._8_4_ = fVar54 * auVar44._8_4_ + fVar47 * auVar18._8_4_;
  auVar42._12_4_ = fVar55 * auVar44._12_4_ + fVar48 * auVar18._12_4_;
  local_200._0_4_ = fVar43 * auVar30._0_4_ + fVar51 * auVar36._0_4_;
  local_200._4_4_ = fVar46 * auVar30._4_4_ + fVar53 * auVar36._4_4_;
  local_200._8_4_ = fVar47 * auVar30._8_4_ + fVar54 * auVar36._8_4_;
  local_200._12_4_ = fVar48 * auVar30._12_4_ + fVar55 * auVar36._12_4_;
  local_2a0._0_4_ = auVar20._0_4_;
  local_2a0._4_4_ = auVar20._4_4_;
  fStack_298 = auVar20._8_4_;
  fStack_294 = auVar20._12_4_;
  local_210 = fVar43 * (float)local_2a0._0_4_ + fVar51 * auVar56._0_4_;
  fStack_20c = fVar46 * (float)local_2a0._4_4_ + fVar53 * auVar56._4_4_;
  fStack_208 = fVar47 * fStack_298 + fVar54 * auVar56._8_4_;
  fStack_204 = fVar48 * fStack_294 + fVar55 * auVar56._12_4_;
  local_290._0_4_ = auVar35._0_4_;
  local_290._4_4_ = auVar35._4_4_;
  fStack_288 = auVar35._8_4_;
  fStack_284 = auVar35._12_4_;
  local_220 = fVar43 * (float)local_290._0_4_ + fVar51 * auVar40._0_4_;
  fStack_21c = fVar46 * (float)local_290._4_4_ + fVar53 * auVar40._4_4_;
  fStack_218 = fVar47 * fStack_288 + fVar54 * auVar40._8_4_;
  fStack_214 = fVar48 * fStack_284 + fVar55 * auVar40._12_4_;
  local_2e0 = auVar19._0_4_;
  fStack_2dc = auVar19._4_4_;
  fStack_2d8 = auVar19._8_4_;
  fStack_2d4 = auVar19._12_4_;
  local_230 = fVar43 * local_2e0 + fVar51 * auVar49._0_4_;
  fStack_22c = fVar46 * fStack_2dc + fVar53 * auVar49._4_4_;
  fStack_228 = fVar47 * fStack_2d8 + fVar54 * auVar49._8_4_;
  fStack_224 = fVar48 * fStack_2d4 + fVar55 * auVar49._12_4_;
  local_1f0 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar29._0_4_ = fVar1 * local_210 + local_220 * fVar2 + fVar3 * local_230;
  auVar29._4_4_ = fVar1 * fStack_20c + fStack_21c * fVar2 + fVar3 * fStack_22c;
  auVar29._8_4_ = fVar1 * fStack_208 + fStack_218 * fVar2 + fVar3 * fStack_228;
  auVar29._12_4_ = fVar1 * fStack_204 + fStack_214 * fVar2 + fVar3 * fStack_224;
  auVar38 = vcmpps_avx(auVar29,ZEXT416(0) << 0x20,4);
  auVar35._8_4_ = 0x3f800000;
  auVar35._0_8_ = 0x3f8000003f800000;
  auVar35._12_4_ = 0x3f800000;
  auVar29 = vblendvps_avx(auVar35,auVar29,auVar38);
  auVar30 = vunpcklps_avx(auVar31,auVar9);
  auVar35 = vunpcklps_avx(auVar41,auVar16);
  auVar56._0_4_ = fVar43 * auVar35._0_4_ + fVar51 * auVar30._0_4_;
  auVar56._4_4_ = fVar46 * auVar35._4_4_ + fVar53 * auVar30._4_4_;
  auVar56._8_4_ = fVar47 * auVar35._8_4_ + fVar54 * auVar30._8_4_;
  auVar56._12_4_ = fVar48 * auVar35._12_4_ + fVar55 * auVar30._12_4_;
  fVar4 = *(float *)(ray + k * 4 + 0x40);
  auVar30._4_4_ = fVar4;
  auVar30._0_4_ = fVar4;
  auVar30._8_4_ = fVar4;
  auVar30._12_4_ = fVar4;
  auVar30 = vsubps_avx(auVar56,auVar30);
  fVar5 = *(float *)(ray + k * 4 + 0x20);
  auVar36._4_4_ = fVar5;
  auVar36._0_4_ = fVar5;
  auVar36._8_4_ = fVar5;
  auVar36._12_4_ = fVar5;
  auVar35 = vsubps_avx(local_200,auVar36);
  fVar6 = *(float *)(ray + k * 4);
  auVar40._4_4_ = fVar6;
  auVar40._0_4_ = fVar6;
  auVar40._8_4_ = fVar6;
  auVar40._12_4_ = fVar6;
  auVar36 = vsubps_avx(auVar42,auVar40);
  auVar49._0_4_ = auVar36._0_4_ * local_210 + local_220 * auVar35._0_4_ + local_230 * auVar30._0_4_;
  auVar49._4_4_ =
       auVar36._4_4_ * fStack_20c + fStack_21c * auVar35._4_4_ + fStack_22c * auVar30._4_4_;
  auVar49._8_4_ =
       auVar36._8_4_ * fStack_208 + fStack_218 * auVar35._8_4_ + fStack_228 * auVar30._8_4_;
  auVar49._12_4_ =
       auVar36._12_4_ * fStack_204 + fStack_214 * auVar35._12_4_ + fStack_224 * auVar30._12_4_;
  local_1c0 = vdivps_avx(auVar49,auVar29);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar44._4_4_ = uVar7;
  auVar44._0_4_ = uVar7;
  auVar44._8_4_ = uVar7;
  auVar44._12_4_ = uVar7;
  auVar29 = vcmpps_avx(auVar44,local_1c0,2);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  local_240._4_4_ = uVar7;
  local_240._0_4_ = uVar7;
  local_240._8_4_ = uVar7;
  local_240._12_4_ = uVar7;
  auVar30 = vcmpps_avx(local_1c0,local_240,2);
  auVar29 = vandps_avx(auVar30,auVar29);
  auVar30 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar30 = vpcmpgtd_avx(auVar30,_DAT_01f4ad30);
  auVar29 = vandps_avx(auVar30,auVar29);
  auVar30 = auVar38 & auVar29;
  if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar30[0xf] < '\0') {
    auVar29 = vandps_avx(auVar29,auVar38);
    auVar38 = vunpckhps_avx(auVar41,auVar16);
    auVar30 = vunpckhps_avx(auVar31,auVar9);
    fVar43 = fVar51 * auVar30._0_4_ + fVar43 * auVar38._0_4_;
    fVar46 = fVar53 * auVar30._4_4_ + fVar46 * auVar38._4_4_;
    fVar47 = fVar54 * auVar30._8_4_ + fVar47 * auVar38._8_4_;
    fVar48 = fVar55 * auVar30._12_4_ + fVar48 * auVar38._12_4_;
    fVar51 = local_1c0._0_4_;
    fVar53 = local_1c0._4_4_;
    fVar54 = local_1c0._8_4_;
    fVar55 = local_1c0._12_4_;
    auVar41._0_4_ = fVar1 * fVar51 + fVar6;
    auVar41._4_4_ = fVar1 * fVar53 + fVar6;
    auVar41._8_4_ = fVar1 * fVar54 + fVar6;
    auVar41._12_4_ = fVar1 * fVar55 + fVar6;
    auVar37._0_4_ = fVar2 * fVar51 + fVar5;
    auVar37._4_4_ = fVar2 * fVar53 + fVar5;
    auVar37._8_4_ = fVar2 * fVar54 + fVar5;
    auVar37._12_4_ = fVar2 * fVar55 + fVar5;
    auVar31._0_4_ = fVar3 * fVar51 + fVar4;
    auVar31._4_4_ = fVar3 * fVar53 + fVar4;
    auVar31._8_4_ = fVar3 * fVar54 + fVar4;
    auVar31._12_4_ = fVar3 * fVar55 + fVar4;
    auVar38 = vsubps_avx(auVar41,auVar42);
    auVar30 = vsubps_avx(auVar37,local_200);
    auVar35 = vsubps_avx(auVar31,auVar56);
    auVar32._0_4_ =
         auVar38._0_4_ * auVar38._0_4_ +
         auVar30._0_4_ * auVar30._0_4_ + auVar35._0_4_ * auVar35._0_4_;
    auVar32._4_4_ =
         auVar38._4_4_ * auVar38._4_4_ +
         auVar30._4_4_ * auVar30._4_4_ + auVar35._4_4_ * auVar35._4_4_;
    auVar32._8_4_ =
         auVar38._8_4_ * auVar38._8_4_ +
         auVar30._8_4_ * auVar30._8_4_ + auVar35._8_4_ * auVar35._8_4_;
    auVar32._12_4_ =
         auVar38._12_4_ * auVar38._12_4_ +
         auVar30._12_4_ * auVar30._12_4_ + auVar35._12_4_ * auVar35._12_4_;
    auVar38._0_4_ = fVar43 * fVar43;
    auVar38._4_4_ = fVar46 * fVar46;
    auVar38._8_4_ = fVar47 * fVar47;
    auVar38._12_4_ = fVar48 * fVar48;
    auVar38 = vcmpps_avx(auVar32,auVar38,1);
    auVar29 = vandps_avx(auVar38,auVar29);
    iVar22 = vmovmskps_avx(auVar29);
    if (iVar22 != 0) {
      uStack_278 = auVar16._8_8_;
      local_280 = Disc;
      local_1e0 = ZEXT832(0) << 0x20;
      local_1b0 = CONCAT44(fStack_20c,local_210);
      uStack_1a8 = CONCAT44(fStack_204,fStack_208);
      local_1a0 = CONCAT44(fStack_21c,local_220);
      uStack_198 = CONCAT44(fStack_214,fStack_218);
      local_190 = CONCAT44(fStack_22c,local_230);
      uStack_188 = CONCAT44(fStack_224,fStack_228);
      uVar28 = (ulong)(byte)iVar22;
      uVar21 = 1 << ((byte)k & 0x1f);
      auVar39 = ZEXT1632(CONCAT412(fVar48,CONCAT48(fVar47,CONCAT44(fVar46,fVar43))));
      auVar39 = vcmpps_avx(auVar39,auVar39,0xf);
      auVar45 = ZEXT3264(auVar39);
      auVar50 = ZEXT464(0) << 0x20;
      auVar52 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      _local_2a0 = auVar42;
      _local_290 = auVar9;
      do {
        local_270.hit = local_180;
        local_270.valid = (int *)local_2c0;
        uVar23 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        uVar10 = *(uint *)(local_1f0 + uVar23 * 4);
        pGVar12 = (pSVar11->geometries).items[uVar10].ptr;
        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_120 = *(undefined4 *)(local_1e0 + uVar23 * 4);
          local_100 = *(undefined4 *)(local_1e0 + uVar23 * 4 + 0x10);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1c0 + uVar23 * 4);
          local_270.context = context->user;
          local_e0 = *(undefined4 *)((long)local_280 + 0x10 + uVar23 * 4);
          uVar7 = *(undefined4 *)((long)&local_1b0 + uVar23 * 4);
          uVar8 = *(undefined4 *)((long)&local_1a0 + uVar23 * 4);
          local_160._4_4_ = uVar8;
          local_160._0_4_ = uVar8;
          local_160._8_4_ = uVar8;
          local_160._12_4_ = uVar8;
          local_160._16_4_ = uVar8;
          local_160._20_4_ = uVar8;
          local_160._24_4_ = uVar8;
          local_160._28_4_ = uVar8;
          local_b0 = vpshufd_avx(ZEXT416(uVar10),0);
          uVar8 = *(undefined4 *)((long)&local_190 + uVar23 * 4);
          local_140._4_4_ = uVar8;
          local_140._0_4_ = uVar8;
          local_140._8_4_ = uVar8;
          local_140._12_4_ = uVar8;
          local_140._16_4_ = uVar8;
          local_140._20_4_ = uVar8;
          local_140._24_4_ = uVar8;
          local_140._28_4_ = uVar8;
          local_180[0] = (RTCHitN)(char)uVar7;
          local_180[1] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar7;
          local_180[5] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar7;
          local_180[9] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar7;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar7;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar7;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar7;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar7;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          uStack_9c = (local_270.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_270.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_2c0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar21 & 0xf) << 4));
          local_2b0 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar21 >> 4) * 0x10);
          local_270.geometryUserPtr = pGVar12->userPtr;
          local_270.N = 8;
          local_270.ray = (RTCRayN *)ray;
          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar39 = ZEXT1632(auVar45._0_16_);
            (*pGVar12->occlusionFilterN)(&local_270);
            auVar52 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar39 = vcmpps_avx(auVar39,auVar39,0xf);
            auVar45 = ZEXT3264(auVar39);
          }
          auVar29 = vpcmpeqd_avx(auVar50._0_16_,local_2c0);
          auVar38 = vpcmpeqd_avx(auVar50._0_16_,local_2b0);
          auVar39._16_16_ = auVar38;
          auVar39._0_16_ = auVar29;
          auVar39 = auVar45._0_32_ & ~auVar39;
          if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar39 >> 0x7f,0) == '\0') &&
                (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar39 >> 0xbf,0) == '\0') &&
              (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar39[0x1f]) {
            auVar33._0_4_ = auVar29._0_4_ ^ auVar45._0_4_;
            auVar33._4_4_ = auVar29._4_4_ ^ auVar45._4_4_;
            auVar33._8_4_ = auVar29._8_4_ ^ auVar45._8_4_;
            auVar33._12_4_ = auVar29._12_4_ ^ auVar45._12_4_;
            auVar33._16_4_ = auVar38._0_4_ ^ auVar45._16_4_;
            auVar33._20_4_ = auVar38._4_4_ ^ auVar45._20_4_;
            auVar33._24_4_ = auVar38._8_4_ ^ auVar45._24_4_;
            auVar33._28_4_ = auVar38._12_4_ ^ auVar45._28_4_;
          }
          else {
            p_Var15 = context->args->filter;
            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
              auVar39 = ZEXT1632(auVar45._0_16_);
              (*p_Var15)(&local_270);
              auVar52 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar39 = vcmpps_avx(auVar39,auVar39,0xf);
              auVar45 = ZEXT3264(auVar39);
            }
            auVar29 = vpcmpeqd_avx(auVar50._0_16_,local_2c0);
            auVar38 = vpcmpeqd_avx(auVar50._0_16_,local_2b0);
            auVar34._16_16_ = auVar38;
            auVar34._0_16_ = auVar29;
            auVar33._0_4_ = auVar29._0_4_ ^ auVar45._0_4_;
            auVar33._4_4_ = auVar29._4_4_ ^ auVar45._4_4_;
            auVar33._8_4_ = auVar29._8_4_ ^ auVar45._8_4_;
            auVar33._12_4_ = auVar29._12_4_ ^ auVar45._12_4_;
            auVar33._16_4_ = auVar38._0_4_ ^ auVar45._16_4_;
            auVar33._20_4_ = auVar38._4_4_ ^ auVar45._20_4_;
            auVar33._24_4_ = auVar38._8_4_ ^ auVar45._24_4_;
            auVar33._28_4_ = auVar38._12_4_ ^ auVar45._28_4_;
            auVar39 = vblendvps_avx(auVar52._0_32_,*(undefined1 (*) [32])(local_270.ray + 0x100),
                                    auVar34);
            *(undefined1 (*) [32])(local_270.ray + 0x100) = auVar39;
          }
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar33 >> 0x7f,0) != '\0') ||
                (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar33 >> 0xbf,0) != '\0') ||
              (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar33[0x1f] < '\0') {
            return true;
          }
          *(int *)(ray + k * 4 + 0x100) = local_240._0_4_;
        }
        uVar28 = uVar28 ^ 1L << (uVar23 & 0x3f);
      } while (uVar28 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }